

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refmap.c
# Opt level: O3

flatcc_refmap_ref_t flatcc_refmap_insert(flatcc_refmap_t *refmap,void *src,flatcc_refmap_ref_t ref)

{
  flatcc_refmap_item *pfVar1;
  void *pvVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (src != (void *)0x0) {
    sVar3 = refmap->buckets;
    if (sVar3 * 0xb3 >> 8 <= refmap->count) {
      flatcc_refmap_resize(refmap,refmap->count * 2);
      sVar3 = refmap->buckets;
    }
    pfVar1 = refmap->table;
    uVar4 = ((ulong)src >> 0x21 ^ (ulong)src ^ 0x2f693b52) * -0xae502812aa7333;
    uVar4 = (uVar4 >> 0x21 ^ uVar4) * -0x3b314601e57a13ad;
    uVar4 = uVar4 >> 0x21 ^ uVar4;
    uVar5 = uVar4 & sVar3 - 1;
    pvVar2 = pfVar1[uVar5].src;
    while (pvVar2 != (void *)0x0) {
      if (pvVar2 == src) goto LAB_00107ea4;
      uVar4 = uVar4 + 1;
      uVar5 = uVar4 & sVar3 - 1;
      pvVar2 = pfVar1[uVar5].src;
    }
    refmap->count = refmap->count + 1;
    pfVar1[uVar5].src = src;
LAB_00107ea4:
    pfVar1[uVar5].ref = ref;
  }
  return ref;
}

Assistant:

flatcc_refmap_ref_t flatcc_refmap_insert(flatcc_refmap_t *refmap, const void *src, flatcc_refmap_ref_t ref)
{
    struct flatcc_refmap_item *T;
    size_t N, i, j, k;

    if (src == 0) return ref;
    if (_flatcc_refmap_above_load_factor(refmap->count, refmap->buckets)) {
        if (flatcc_refmap_resize(refmap, refmap->count * 2)) {
            return flatcc_refmap_not_found; /* alloc failed */
        }
    }
    T = refmap->table;
    N = refmap->buckets - 1;
    k = _flatcc_refmap_hash(src);
    i = 0;
    j = _flatcc_refmap_probe(k, i, N);
    while (T[j].src) {
        if (T[j].src == src) {
            return T[j].ref = ref;
        }
        ++i;
        j = _flatcc_refmap_probe(k, i, N);
    }
    ++refmap->count;
    T[j].src = src;
    return T[j].ref = ref;
}